

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall Imf_3_4::Array2D<float_*>::resizeErase(Array2D<float_*> *this,long sizeX,long sizeY)

{
  float **ppfVar1;
  
  ppfVar1 = (float **)
            operator_new__(-(ulong)((ulong)(sizeY * sizeX) >> 0x3d != 0) | sizeY * sizeX * 8);
  if (this->_data != (float **)0x0) {
    operator_delete__(this->_data);
  }
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  this->_data = ppfVar1;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}